

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef
BinaryenArrayNewFixed
          (BinaryenModuleRef module,BinaryenHeapType type,BinaryenExpressionRef *values,
          BinaryenIndex numValues)

{
  ArrayNewFixed *pAVar1;
  ulong uVar2;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> vals;
  Builder local_38;
  
  auStack_58 = (undefined1  [8])0x0;
  vals.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vals.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (numValues != 0) {
    uVar2 = 0;
    do {
      local_38.wasm = (Module *)values[uVar2];
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_58,
                 (Expression **)&local_38);
      uVar2 = uVar2 + 1;
    } while (numValues != uVar2);
  }
  local_38.wasm = module;
  pAVar1 = wasm::Builder::makeArrayNewFixed
                     (&local_38,(HeapType)type,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_58)
  ;
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    (long)vals.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
  }
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenArrayNewFixed(BinaryenModuleRef module,
                                            BinaryenHeapType type,
                                            BinaryenExpressionRef* values,
                                            BinaryenIndex numValues) {
  std::vector<Expression*> vals;
  for (BinaryenIndex i = 0; i < numValues; i++) {
    vals.push_back((Expression*)values[i]);
  }
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeArrayNewFixed(HeapType(type), vals));
}